

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::RenderInstanceShaders::addStage
          (RenderInstanceShaders *this,DeviceInterface *vki,VkDevice device,
          VkPhysicalDeviceFeatures *deviceFeatures,BinaryCollection *programCollection,char *name,
          VkShaderStageFlagBits stage,Move<vk::Handle<(vk::HandleType)14>_> *outModule)

{
  VkShaderStageFlagBits stage_00;
  bool bVar1;
  ProgramBinary *binary;
  NotSupportedError *this_00;
  allocator<char> local_91;
  DeviceInterface *local_90;
  VkDevice local_88;
  Move<vk::Handle<(vk::HandleType)14>_> module;
  VkPipelineShaderStageCreateInfo stageCreateInfo;
  
  stage_00 = stage;
  local_90 = vki;
  local_88 = device;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stageCreateInfo,name,(allocator<char> *)&module);
  bVar1 = de::
          contains<std::map<std::__cxx11::string,vk::ProgramBinary*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,vk::ProgramBinary*>>>>
                    (&programCollection->m_programs,(key_type *)&stageCreateInfo);
  std::__cxx11::string::~string((string *)&stageCreateInfo);
  if (bVar1) {
    bVar1 = ::vk::isShaderStageSupported(deviceFeatures,stage_00);
    if (!bVar1) {
      (*local_90->_vptr_DeviceInterface[4])(local_90,local_88);
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<vk::VkShaderStageFlagBits>((string *)&module,&stage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stageCreateInfo,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&module,
                     " is not supported");
      tcu::NotSupportedError::NotSupportedError
                (this_00,(char *)CONCAT44(stageCreateInfo._4_4_,stageCreateInfo.sType),(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                 ,0x3ae);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&stageCreateInfo,name,&local_91);
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get
                       (programCollection,(string *)&stageCreateInfo);
    ::vk::createShaderModule(&module,local_90,local_88,binary,0);
    std::__cxx11::string::~string((string *)&stageCreateInfo);
    stageCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    stageCreateInfo.pNext = (void *)0x0;
    stageCreateInfo.flags = 0;
    stageCreateInfo.stage = stage_00;
    stageCreateInfo.module.m_internal =
         module.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
    stageCreateInfo.pName = "main";
    stageCreateInfo.pSpecializationInfo = (VkSpecializationInfo *)0x0;
    std::
    vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
    ::emplace_back<vk::VkPipelineShaderStageCreateInfo>(&this->m_stageInfos,&stageCreateInfo);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=(outModule,&module);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
              (&module.super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  }
  return;
}

Assistant:

void RenderInstanceShaders::addStage (const vk::DeviceInterface&			vki,
									  vk::VkDevice							device,
									  const vk::VkPhysicalDeviceFeatures&	deviceFeatures,
									  const vk::BinaryCollection&			programCollection,
									  const char*							name,
									  vk::VkShaderStageFlagBits				stage,
									  vk::Move<vk::VkShaderModule>*			outModule)
{
	if (programCollection.contains(name))
	{
		if (vk::isShaderStageSupported(deviceFeatures, stage))
		{
			vk::Move<vk::VkShaderModule>	module	= createShaderModule(vki, device, programCollection.get(name), (vk::VkShaderModuleCreateFlags)0);

			m_stageInfos.push_back(getShaderStageCreateInfo(stage, *module));
			*outModule = module;
		}
		else
		{
			// Wait for the GPU to idle so that throwing the exception
			// below doesn't free in-use GPU resource.
			vki.deviceWaitIdle(device);
			TCU_THROW(NotSupportedError, (de::toString(stage) + " is not supported").c_str());
		}
	}
}